

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_cgreen_pipe.c
# Opt level: O1

int cgreen_pipe_open(int *pipes)

{
  int iVar1;
  
  iVar1 = pipe(pipes);
  if (iVar1 == 0) {
    iVar1 = 0;
    fcntl(pipes[1],4,0x800);
  }
  return iVar1;
}

Assistant:

int cgreen_pipe_open(int pipes[2])
{
    int pipe_open_result;
    int pipe_nonblock_result;

    pipe_open_result = pipe(pipes);

    if (pipe_open_result != 0) {
        return pipe_open_result;
    }

    pipe_nonblock_result = fcntl(pipes[1], F_SETFL, O_NONBLOCK);

    if (pipe_nonblock_result != 0) {
        return pipe_open_result;
    }

    return 0;
}